

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O1

int Nwk_ManPushBackwardFast_rec(Nwk_Obj_t *pObj,Nwk_Obj_t *pPred)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = pObj->pMan->nTravIds;
  iVar3 = 0;
  if (pObj->TravId != iVar1) {
    pObj->TravId = iVar1;
    uVar2 = *(uint *)&pObj->field_0x20;
    iVar3 = 0;
    if ((uVar2 & 0x20) == 0) {
      if ((uVar2 & 0x10) == 0) {
        if (0 < pObj->nFanins) {
          iVar3 = 0;
          lVar4 = 0;
          do {
            if (pObj->pFanio[lVar4] == (Nwk_Obj_t *)0x0) {
              return 0;
            }
            iVar1 = Nwk_ManPushBackwardFast_rec(pObj->pFanio[lVar4],pObj);
            if (iVar1 != 0) {
              uVar2 = *(uint *)&pObj->field_0x20;
              goto LAB_008ddac4;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < pObj->nFanins);
        }
      }
      else {
LAB_008ddac4:
        *(uint *)&pObj->field_0x20 = uVar2 | 0x20;
        pObj->pCopy = pPred;
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int Nwk_ManPushBackwardFast_rec( Nwk_Obj_t * pObj, Nwk_Obj_t * pPred )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return 0;
    Nwk_ObjSetTravIdCurrent( pObj );
    if ( Nwk_ObjHasFlow(pObj) )
        return 0;
    if ( Nwk_ObjIsSink(pObj) )
    {
        Nwk_ObjSetFlow(pObj);
        return Nwk_ObjSetPred( pObj, pPred );
    }
    Nwk_ObjForEachFanin( pObj, pNext, i )
        if ( Nwk_ManPushBackwardFast_rec( pNext, pObj ) )
        {
            Nwk_ObjSetFlow(pObj);
            return Nwk_ObjSetPred( pObj, pPred );
        }
    return 0;
}